

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::find_or_prepare_insert_non_soo<char[21]>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *this,char (*key) [21])

{
  ctrl_t *pcVar1;
  ulong uVar2;
  ctrl_t *pcVar3;
  void *pvVar4;
  uint uVar5;
  ushort uVar6;
  ctrl_t cVar7;
  ctrl_t cVar8;
  ctrl_t cVar9;
  ctrl_t cVar10;
  ctrl_t cVar11;
  ctrl_t cVar12;
  ctrl_t cVar13;
  ctrl_t cVar14;
  ctrl_t cVar15;
  ctrl_t cVar16;
  ctrl_t cVar17;
  ctrl_t cVar18;
  ctrl_t cVar19;
  ctrl_t cVar20;
  ctrl_t cVar21;
  ctrl_t cVar22;
  ctrl_t cVar23;
  ctrl_t cVar24;
  ctrl_t cVar25;
  ctrl_t cVar26;
  ctrl_t cVar27;
  ctrl_t cVar28;
  ctrl_t cVar29;
  ctrl_t cVar30;
  ctrl_t cVar31;
  ctrl_t cVar32;
  ctrl_t cVar33;
  ctrl_t cVar34;
  ctrl_t cVar35;
  ctrl_t cVar36;
  ctrl_t cVar37;
  ctrl_t cVar38;
  undefined1 uVar39;
  bool bVar40;
  ushort uVar41;
  uint uVar42;
  size_t sVar43;
  uint64_t uVar44;
  size_t sVar45;
  anon_union_8_1_a8a14541_for_iterator_2 aVar46;
  ctrl_t *pcVar47;
  ulong uVar48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs;
  bool bVar49;
  undefined7 in_register_00000089;
  ulong uVar50;
  CommonFields *common;
  uchar *bytes;
  long lVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  FindInfo target;
  __m128i match;
  ulong local_a0;
  char (*local_68) [21];
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_60;
  undefined1 local_58 [16];
  ctrl_t local_48;
  ctrl_t cStack_47;
  ctrl_t cStack_46;
  ctrl_t cStack_45;
  ctrl_t cStack_44;
  ctrl_t cStack_43;
  ctrl_t cStack_42;
  ctrl_t cStack_41;
  ctrl_t cStack_40;
  ctrl_t cStack_3f;
  ctrl_t cStack_3e;
  ctrl_t cStack_3d;
  ctrl_t cStack_3c;
  ctrl_t cStack_3b;
  ctrl_t cStack_3a;
  ctrl_t cStack_39;
  
  sVar43 = strlen(*key);
  uVar44 = hash_internal::MixingHashState::CombineContiguousImpl
                     (&hash_internal::MixingHashState::kSeed,key,sVar43);
  uVar2 = (this->settings_).
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          capacity_;
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar50 = (uVar44 ^ sVar43) * -0x234dd359734ecb13;
  common = (CommonFields *)
           (uVar50 >> 0x38 | (uVar50 & 0xff000000000000) >> 0x28 | (uVar50 & 0xff0000000000) >> 0x18
            | (uVar50 & 0xff00000000) >> 8 | (uVar50 & 0xff000000) << 8 |
            (uVar50 & 0xff0000) << 0x18 | (uVar50 & 0xff00) << 0x28 | uVar50 << 0x38);
  pcVar3 = (this->settings_).
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
           heap_or_soo_.heap.control;
  uVar48 = ((ulong)common >> 7 ^ (ulong)pcVar3 >> 0xc) & uVar2;
  uVar39 = (undefined1)(uVar50 >> 0x38);
  auVar52 = ZEXT216(CONCAT11(uVar39,uVar39) & 0x7f7f);
  auVar52 = pshuflw(auVar52,auVar52,0);
  local_58._0_4_ = auVar52._0_4_;
  local_58._4_4_ = local_58._0_4_;
  local_58._8_4_ = local_58._0_4_;
  local_58._12_4_ = local_58._0_4_;
  pcVar47 = (__return_storage_ptr__->first).ctrl_;
  aVar46 = (__return_storage_ptr__->first).field_1;
  bVar49 = __return_storage_ptr__->second;
  local_a0 = 0;
  do {
    pcVar1 = pcVar3 + uVar48;
    auVar52[0] = -(local_58[0] == *pcVar1);
    auVar52[1] = -(local_58[1] == pcVar1[1]);
    auVar52[2] = -(local_58[2] == pcVar1[2]);
    auVar52[3] = -(local_58[3] == pcVar1[3]);
    auVar52[4] = -(local_58[4] == pcVar1[4]);
    auVar52[5] = -(local_58[5] == pcVar1[5]);
    auVar52[6] = -(local_58[6] == pcVar1[6]);
    auVar52[7] = -(local_58[7] == pcVar1[7]);
    auVar52[8] = -(local_58[8] == pcVar1[8]);
    auVar52[9] = -(local_58[9] == pcVar1[9]);
    auVar52[10] = -(local_58[10] == pcVar1[10]);
    auVar52[0xb] = -(local_58[0xb] == pcVar1[0xb]);
    auVar52[0xc] = -(local_58[0xc] == pcVar1[0xc]);
    auVar52[0xd] = -(local_58[0xd] == pcVar1[0xd]);
    auVar52[0xe] = -(local_58[0xe] == pcVar1[0xe]);
    auVar52[0xf] = -(local_58[0xf] == pcVar1[0xf]);
    uVar41 = (ushort)(SUB161(auVar52 >> 7,0) & 1) | (ushort)(SUB161(auVar52 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar52 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar52 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar52 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar52 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar52 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar52 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar52 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar52 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar52 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar52 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar52 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar52 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar52 >> 0x77,0) & 1) << 0xe | (ushort)(auVar52[0xf] >> 7) << 0xf;
    uVar42 = (uint)uVar41;
    cVar23 = *pcVar1;
    cVar24 = pcVar1[1];
    cVar25 = pcVar1[2];
    cVar26 = pcVar1[3];
    cVar27 = pcVar1[4];
    cVar28 = pcVar1[5];
    cVar29 = pcVar1[6];
    cVar30 = pcVar1[7];
    cVar31 = pcVar1[8];
    cVar32 = pcVar1[9];
    cVar33 = pcVar1[10];
    cVar34 = pcVar1[0xb];
    cVar35 = pcVar1[0xc];
    cVar36 = pcVar1[0xd];
    cVar37 = pcVar1[0xe];
    cVar38 = pcVar1[0xf];
    cVar7 = local_48;
    cVar8 = cStack_47;
    cVar9 = cStack_46;
    cVar10 = cStack_45;
    cVar11 = cStack_44;
    cVar12 = cStack_43;
    cVar13 = cStack_42;
    cVar14 = cStack_41;
    cVar15 = cStack_40;
    cVar16 = cStack_3f;
    cVar17 = cStack_3e;
    cVar18 = cStack_3d;
    cVar19 = cStack_3c;
    cVar20 = cStack_3b;
    cVar21 = cStack_3a;
    cVar22 = cStack_39;
    while (cStack_39 = cVar38, cStack_3a = cVar37, cStack_3b = cVar36, cStack_3c = cVar35,
          cStack_3d = cVar34, cStack_3e = cVar33, cStack_3f = cVar32, cStack_40 = cVar31,
          cStack_41 = cVar30, cStack_42 = cVar29, cStack_43 = cVar28, cStack_44 = cVar27,
          cStack_45 = cVar26, cStack_46 = cVar25, cStack_47 = cVar24, local_48 = cVar23, uVar41 != 0
          ) {
      uVar5 = 0;
      if (uVar42 != 0) {
        for (; (uVar42 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      uVar50 = uVar5 + uVar48 & uVar2;
      lVar51 = uVar50 * 0x20;
      lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)(this->settings_).
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.heap_or_soo_.heap.slot_array.p + lVar51);
      local_68 = key;
      local_60 = this;
      bVar40 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
               ::EqualElement<char[21]>::operator()(&local_68,lhs,lhs);
      if (bVar40) {
        (__return_storage_ptr__->first).field_1 = aVar46;
        __return_storage_ptr__->second = bVar49;
        (__return_storage_ptr__->first).ctrl_ = pcVar47;
        pcVar3 = (this->settings_).
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                 value.heap_or_soo_.heap.control;
        if (pcVar3 != (ctrl_t *)0x0) {
          pvVar4 = (this->settings_).
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.heap_or_soo_.heap.slot_array.p;
          (__return_storage_ptr__->first).ctrl_ = pcVar3 + uVar50;
          (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(lVar51 + (long)pvVar4);
          __return_storage_ptr__->second = false;
          return __return_storage_ptr__;
        }
        goto LAB_001d3cd4;
      }
      uVar41 = (ushort)(uVar42 - 1) & (ushort)uVar42;
      uVar42 = CONCAT22((short)(uVar42 - 1 >> 0x10),uVar41);
      cVar23 = local_48;
      cVar24 = cStack_47;
      cVar25 = cStack_46;
      cVar26 = cStack_45;
      cVar27 = cStack_44;
      cVar28 = cStack_43;
      cVar29 = cStack_42;
      cVar30 = cStack_41;
      cVar31 = cStack_40;
      cVar32 = cStack_3f;
      cVar33 = cStack_3e;
      cVar34 = cStack_3d;
      cVar35 = cStack_3c;
      cVar36 = cStack_3b;
      cVar37 = cStack_3a;
      cVar38 = cStack_39;
      cVar7 = local_48;
      cVar8 = cStack_47;
      cVar9 = cStack_46;
      cVar10 = cStack_45;
      cVar11 = cStack_44;
      cVar12 = cStack_43;
      cVar13 = cStack_42;
      cVar14 = cStack_41;
      cVar15 = cStack_40;
      cVar16 = cStack_3f;
      cVar17 = cStack_3e;
      cVar18 = cStack_3d;
      cVar19 = cStack_3c;
      cVar20 = cStack_3b;
      cVar21 = cStack_3a;
      cVar22 = cStack_39;
    }
    auVar53[0] = -(local_48 == kEmpty);
    auVar53[1] = -(cStack_47 == kEmpty);
    auVar53[2] = -(cStack_46 == kEmpty);
    auVar53[3] = -(cStack_45 == kEmpty);
    auVar53[4] = -(cStack_44 == kEmpty);
    auVar53[5] = -(cStack_43 == kEmpty);
    auVar53[6] = -(cStack_42 == kEmpty);
    auVar53[7] = -(cStack_41 == kEmpty);
    auVar53[8] = -(cStack_40 == kEmpty);
    auVar53[9] = -(cStack_3f == kEmpty);
    auVar53[10] = -(cStack_3e == kEmpty);
    auVar53[0xb] = -(cStack_3d == kEmpty);
    auVar53[0xc] = -(cStack_3c == kEmpty);
    auVar53[0xd] = -(cStack_3b == kEmpty);
    auVar53[0xe] = -(cStack_3a == kEmpty);
    auVar53[0xf] = -(cStack_39 == kEmpty);
    uVar41 = (ushort)(SUB161(auVar53 >> 7,0) & 1) | (ushort)(SUB161(auVar53 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar53 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar53 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar53 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar53 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar53 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar53 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar53 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar53 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar53 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar53 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar53 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar53 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar53 >> 0x77,0) & 1) << 0xe | (ushort)(auVar53[0xf] >> 7) << 0xf;
    local_48 = cVar7;
    cStack_47 = cVar8;
    cStack_46 = cVar9;
    cStack_45 = cVar10;
    cStack_44 = cVar11;
    cStack_43 = cVar12;
    cStack_42 = cVar13;
    cStack_41 = cVar14;
    cStack_40 = cVar15;
    cStack_3f = cVar16;
    cStack_3e = cVar17;
    cStack_3d = cVar18;
    cStack_3c = cVar19;
    cStack_3b = cVar20;
    cStack_3a = cVar21;
    cStack_39 = cVar22;
    if (uVar41 == 0) {
      if ((this->settings_).
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          capacity_ < local_a0 + 0x10) {
        (__return_storage_ptr__->first).field_1 = aVar46;
        __return_storage_ptr__->second = bVar49;
        (__return_storage_ptr__->first).ctrl_ = pcVar47;
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xf7d,
                      "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::basic_string<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::basic_string<char>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<std::basic_string<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::basic_string<char>>, K = char[21]]"
                     );
      }
      uVar48 = uVar48 + local_a0 + 0x10 & uVar2;
      local_a0 = local_a0 + 0x10;
    }
    else {
      uVar39 = bVar49;
      bVar40 = ShouldInsertBackwardsForDebug
                         ((this->settings_).
                          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                          .
                          super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                          .value.capacity_,(size_t)common,
                          (this->settings_).
                          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                          .
                          super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                          .value.heap_or_soo_.heap.control);
      if (bVar40) {
        uVar6 = 0xf;
        if (uVar41 != 0) {
          for (; uVar41 >> uVar6 == 0; uVar6 = uVar6 - 1) {
          }
        }
        uVar42 = (ushort)((uVar6 ^ 0xfff0) + 0x11) - 1;
      }
      else {
        uVar42 = 0;
        if (uVar41 != 0) {
          for (; (uVar41 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
          }
        }
      }
      target.probe_length =
           (size_t)raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                   ::GetPolicyFunctions()::value;
      target.offset = local_a0;
      sVar45 = PrepareInsertNonSoo((container_internal *)this,common,uVar42 + uVar48 & uVar2,target,
                                   (PolicyFunctions *)CONCAT71(in_register_00000089,uVar39));
      pcVar1 = (this->settings_).
               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
               .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
               value.heap_or_soo_.heap.control;
      if (pcVar1 == (ctrl_t *)0x0) {
        (__return_storage_ptr__->first).field_1 = aVar46;
        __return_storage_ptr__->second = bVar49;
        (__return_storage_ptr__->first).ctrl_ = pcVar47;
LAB_001d3cd4:
        __assert_fail("ctrl != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x9ef,
                      "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::basic_string<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::basic_string<char>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashSetPolicy<std::basic_string<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::basic_string<char>>]"
                     );
      }
      pcVar47 = pcVar1 + sVar45;
      aVar46.slot_ = (slot_type *)
                     (sVar45 * 0x20 +
                     (long)(this->settings_).
                           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                           .
                           super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                           .value.heap_or_soo_.heap.slot_array.p);
      bVar49 = true;
    }
    if (uVar41 != 0) {
      (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)aVar46;
      __return_storage_ptr__->second = bVar49;
      (__return_storage_ptr__->first).ctrl_ = pcVar47;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      ABSL_SWISSTABLE_ASSERT(seq.index() <= capacity() && "full table!");
    }
  }